

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O3

_Bool rtosc_match_partial(char *a,char *b)

{
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *in_RSI;
  char *in_RDI;
  char *local_30;
  char *local_28;
  
  local_30 = in_RSI;
  local_28 = in_RDI;
  uVar3 = rtosc_subpath_pat_type(in_RSI);
  if (uVar3 == 1) {
    return true;
  }
  if ((uVar3 & 6) == 2) {
    do {
      _Var2 = rtosc_match_char(&local_28,&local_30);
    } while (_Var2);
    cVar1 = *local_30;
    if (*local_28 != '\0') {
      if (cVar1 != '*') {
        return false;
      }
      cVar1 = local_30[1];
    }
    if (cVar1 == '\0') {
      return true;
    }
  }
  else if (uVar3 == 7) {
    do {
      _Var2 = rtosc_match_char(&local_28,&local_30);
    } while (_Var2);
    if (((*local_28 != '\0') && (*local_30 == '#')) && (local_30[1] != '\0')) {
      iVar4 = atoi(local_28);
      iVar5 = atoi(local_30 + 1);
      return iVar4 < iVar5;
    }
  }
  return false;
}

Assistant:

bool rtosc_match_partial(const char *a, const char *b)
{
    //assume a is of the form X
    //assume b is a pattern of the form: (1..6)
    //This is done to avoid backtracking of any kind
    //This is an OSC serialization library, not a regex
    //implementation

    char patternbuf[256];
    (void) patternbuf;
    int type = rtosc_subpath_pat_type(b);

    if(type == RTOSC_MATCH_ALL)
        return true;
    else if(type == RTOSC_MATCH_CHAR || type == RTOSC_MATCH_PARTIAL_CHAR) {
        while(rtosc_match_char(&a,&b));
        if(!*a && !*b)
            return true;
        else if(*a && *b=='*' && b[1] == '\0')
            return true;
        else
            return false;
    /*
    } else if(type == 4) {
        //extract substring
        const char *sub=NULL;
        return strstr(a,sub);
        */
    } else if(type == RTOSC_MATCH_OPTIONS || type == 6) {
        return false;
    } else if(type == RTOSC_MATCH_ENUMERATED) {
        while(rtosc_match_char(&a,&b));
        if(*a && *b=='#' && b[1] != '\0')
            return atoi(a) < atoi(b+1);
        return false;
    } else
        return 0;
    assert(false);
}